

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall amrex::AmrMesh::ChopGrids(AmrMesh *this,int lev,BoxArray *ba,int target_size)

{
  int iVar1;
  IntVect *pIVar2;
  Long LVar3;
  int in_ECX;
  long in_RDI;
  bool bVar4;
  int new_chunk_size;
  int idim;
  IntVect chunk_prev;
  IntVect chunk;
  size_type in_stack_ffffffffffffff08;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_ffffffffffffff10;
  bool local_cd;
  int local_c8;
  undefined1 local_c4 [12];
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_b8 [2];
  undefined8 local_88;
  int local_7c;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_78;
  int local_6c;
  IntVect *local_68;
  int local_5c;
  long local_58;
  undefined4 local_4c;
  int *local_48;
  BoxArray *local_40;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  BoxArray *in_stack_ffffffffffffffd8;
  
  local_48 = (int *)(in_RDI + 0x84);
  local_4c = 0;
  local_cd = false;
  if ((*local_48 == 0) && (local_cd = false, *(int *)(in_RDI + 0x88) == 0)) {
    local_cd = *(int *)(in_RDI + 0x8c) == 0;
  }
  if (!local_cd) {
    local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_ECX;
    pIVar2 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)pIVar2->vect;
    local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = pIVar2->vect[2];
    do {
      LVar3 = BoxArray::size((BoxArray *)0x10d5cf8);
      if ((int)local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_ <= LVar3) {
        return;
      }
      local_c4._0_8_ =
           local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c4._8_4_ =
           local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish._0_4_;
      for (local_c8 = 2; -1 < local_c8; local_c8 = local_c8 + -1) {
        local_58 = in_RDI + 0x84;
        local_5c = local_c8;
        if (*(int *)(local_58 + (long)local_c8 * 4) != 0) {
          local_78 = local_b8;
          local_7c = local_c8;
          iVar1 = *(int *)((long)&(local_78->
                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)local_c8 * 4) /
                  2;
          LVar3 = BoxArray::size((BoxArray *)0x10d5da0);
          if (LVar3 < (int)local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                           .super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_) {
            local_68 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                 (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            local_6c = local_c8;
            if (iVar1 % local_68->vect[local_c8] == 0) {
              local_88 = local_b8;
              local_b8[1].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = local_c8;
              *(int *)((long)&(((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)local_88)
                              ->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start + (long)local_c8 * 4) = iVar1
              ;
              BoxArray::maxSize(in_stack_ffffffffffffffd8,
                                (IntVect *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
            }
          }
        }
      }
      in_stack_ffffffffffffff10 = local_b8;
      local_40 = (BoxArray *)local_c4;
      bVar4 = false;
      if (local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ == local_c4._0_4_) {
        bVar4 = false;
        if (local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ == local_c4._4_4_) {
          in_stack_ffffffffffffffd4 = 2;
          bVar4 = local_b8[0].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_ == local_c4._8_4_;
          in_stack_ffffffffffffffd8 = local_40;
        }
      }
      local_38 = in_stack_ffffffffffffff10;
    } while (!bVar4);
  }
  return;
}

Assistant:

void
AmrMesh::ChopGrids (int lev, BoxArray& ba, int target_size) const
{
    if (refine_grid_layout_dims == 0) { return; }

    IntVect chunk = max_grid_size[lev];

    while (ba.size() < target_size)
    {
        IntVect chunk_prev = chunk;

        for (int idim = AMREX_SPACEDIM-1; idim >=0; idim--){
            if (refine_grid_layout_dims[idim]){
                int new_chunk_size = chunk[idim] / 2;
                if ( (ba.size() < target_size) && (new_chunk_size%blocking_factor[lev][idim] == 0))
                {
                    chunk[idim] = new_chunk_size;
                    ba.maxSize(chunk);
                }
            }
        }

        if (chunk == chunk_prev){
            break;
        }
    }

}